

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

sunrealtype N_VWrmsNorm_SensWrapper(N_Vector x,N_Vector w)

{
  int i;
  long lVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  
  sVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    sVar3 = N_VWrmsNorm(*(N_Vector *)(*x->content + lVar1 * 8),
                        *(N_Vector *)(*w->content + lVar1 * 8));
    if (sVar3 <= sVar2) {
      sVar3 = sVar2;
    }
    sVar2 = sVar3;
  }
  return sVar2;
}

Assistant:

sunrealtype N_VWrmsNorm_SensWrapper(N_Vector x, N_Vector w)
{
  int i;
  sunrealtype nrm, tmp;

  nrm = ZERO;

  for (i = 0; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VWrmsNorm(NV_VEC_SW(x, i), NV_VEC_SW(w, i));
    if (tmp > nrm) { nrm = tmp; }
  }

  return (nrm);
}